

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_multi_var
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  size_t sVar2;
  code *pcVar3;
  secp256k1_scalar *psVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong local_930;
  secp256k1_strauss_state local_920;
  secp256k1_strauss_point_state ps [1];
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  
  secp256k1_gej_set_infinity(r);
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n != 0) {
      if (scratch != (secp256k1_scratch *)0x0) {
        sVar2 = secp256k1_pippenger_max_points(error_callback,scratch);
        uVar6 = n;
        if (sVar2 != 0) {
          uVar6 = 5000000;
          if (sVar2 < 5000000) {
            uVar6 = sVar2;
          }
          local_930 = (n - 1) / uVar6 + 1;
          uVar6 = (n - 1) / local_930 + 1;
        }
        if (sVar2 != 0) {
          if (uVar6 < 0x58) {
            sVar2 = secp256k1_scratch_max_allocation(error_callback,scratch,5);
            if (0x987 < sVar2) {
              uVar6 = sVar2 / 0x988;
              if (4999999 < uVar6) {
                uVar6 = 5000000;
              }
              local_930 = (n - 1) / uVar6 + 1;
              uVar6 = (n - 1) / local_930 + 1;
            }
            if (sVar2 < 0x988) goto LAB_0014f00a;
            pcVar3 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar3 = secp256k1_ecmult_pippenger_batch;
          }
          lVar7 = 0;
          uVar5 = 0;
          while( true ) {
            uVar8 = uVar6;
            if (n < uVar6) {
              uVar8 = n;
            }
            psVar4 = (secp256k1_scalar *)0x0;
            if (uVar5 == 0) {
              psVar4 = inp_g_sc;
            }
            iVar1 = (*pcVar3)(error_callback,scratch,ps,psVar4,cb,cbdata,uVar8,lVar7);
            if (iVar1 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)ps,(secp256k1_fe *)0x0);
            n = n - uVar8;
            uVar5 = uVar5 + 1;
            lVar7 = lVar7 + uVar6;
            if (local_930 == uVar5) {
              return 1;
            }
          }
          return 0;
        }
      }
LAB_0014f00a:
      iVar1 = secp256k1_ecmult_multi_simple_var(r,inp_g_sc,cb,cbdata,n);
      return iVar1;
    }
    local_920.aux = aux;
    local_920.pre_a = pre_a;
    local_920.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&local_920,r,1,r,&secp256k1_scalar_zero,inp_g_sc);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_callback* error_callback, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_ecmult(r, r, &secp256k1_scalar_zero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }

    /* Compute the batch sizes for Pippenger's algorithm given a scratch space. If it's greater than
     * a threshold use Pippenger's algorithm. Otherwise use Strauss' algorithm.
     * As a first step check if there's enough space for Pippenger's algo (which requires less space
     * than Strauss' algo) and if not, use the simple algorithm. */
    if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_pippenger_max_points(error_callback, scratch), n)) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }
    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_strauss_max_points(error_callback, scratch), n)) {
            return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
        }
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(error_callback, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}